

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

NumericExpr __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprCounter>_>
::ReadNumericExpr(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprCounter>_>
                  *this,char code,bool ignore_zero)

{
  int iVar1;
  NumericExpr NVar2;
  undefined7 in_register_00000031;
  undefined8 local_38;
  undefined8 uStack_30;
  ArgList local_20;
  
  local_20.field_1.values_ = (Value *)&local_38;
  iVar1 = (int)CONCAT71(in_register_00000031,code);
  switch(iVar1) {
  case 0x6c:
  case 0x6e:
  case 0x73:
    ReadConstant(this,code);
    break;
  case 0x6f:
    iVar1 = ReadOpCode(this);
    NVar2 = ReadNumericExpr(this,iVar1);
    return NVar2;
  case 0x76:
    ReadUInt(this,this->num_vars_and_exprs_);
    break;
  default:
    if (iVar1 == 0x66) {
      ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_funcs);
      iVar1 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt(this->reader_);
      if (iVar1 < 1) {
        return OTHER;
      }
      do {
        ReadSymbolicExpr(this);
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
      return OTHER;
    }
  case 0x6d:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x75:
    local_38 = 0;
    uStack_30 = 0;
    local_20.types_ = 0;
    BinaryReaderBase::ReportError
              (&this->reader_->super_BinaryReaderBase,(CStringRef)0x139eda,&local_20);
  }
  return OTHER;
}

Assistant:

typename Handler::NumericExpr
    NLReader<Reader, Handler>::ReadNumericExpr(char code, bool ignore_zero) {
  switch (code) {
  case 'f': {
    // Read a function call.
    int func_index = ReadUInt(header_.num_funcs);
    int num_args = reader_.ReadUInt();
    reader_.ReadTillEndOfLine();
    typename Handler::CallArgHandler args =
        handler_.BeginCall(func_index, num_args);
    for (int i = 0; i < num_args; ++i)
      args.AddArg(ReadSymbolicExpr());
    return handler_.EndCall(args);
  }
  case 'n': case 'l': case 's': {
    // Read a number.
    double value = ReadConstant(code);
    if (ignore_zero && value == 0)
      break;  // Ignore zero constant.
    return handler_.OnNumber(value);
  }
  case 'o':
    return ReadNumericExpr(ReadOpCode());
  case 'v':
    return DoReadReference();
  default:
    reader_.ReportError("expected expression");
  }
  return NumericExpr();
}